

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::MessageDifferencer::TreatAsMapUsingKeyComparator
          (MessageDifferencer *this,FieldDescriptor *field,MapKeyComparator *key_comparator)

{
  LogMessage *pLVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  mapped_type *ppMVar4;
  LogMessage local_70;
  FieldDescriptor *local_38;
  FieldDescriptor *field_local;
  
  local_38 = field;
  if (*(int *)(field + 0x3c) != 3) {
    protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
               ,0x1ad);
    pLVar1 = protobuf::internal::LogMessage::operator<<
                       (&local_70,"CHECK failed: field->is_repeated(): ");
    pLVar1 = protobuf::internal::LogMessage::operator<<(pLVar1,"Field must be repeated: ");
    pLVar1 = protobuf::internal::LogMessage::operator<<(pLVar1,*(string **)(field + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar1);
    protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  iVar2 = std::
          _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
          ::find(&(this->repeated_field_comparisons_)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->repeated_field_comparisons_)._M_t._M_impl.super__Rb_tree_header) {
    protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/message_differencer.cc"
               ,0x1b0);
    pLVar1 = protobuf::internal::LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: repeated_field_comparisons_.find(field) == repeated_field_comparisons_.end(): "
                       );
    pLVar1 = protobuf::internal::LogMessage::operator<<
                       (pLVar1,"Cannot treat the same field as both ");
    pmVar3 = std::
             map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
             ::operator[](&this->repeated_field_comparisons_,&local_38);
    pLVar1 = protobuf::internal::LogMessage::operator<<(pLVar1,*pmVar3);
    pLVar1 = protobuf::internal::LogMessage::operator<<(pLVar1," and MAP. Field name is: ");
    pLVar1 = protobuf::internal::LogMessage::operator<<(pLVar1,*(string **)(local_38 + 8));
    protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&field_local + 7),pLVar1);
    protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  ppMVar4 = std::
            map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
            ::operator[](&this->map_field_key_comparator_,&local_38);
  *ppMVar4 = key_comparator;
  return;
}

Assistant:

void MessageDifferencer::TreatAsMapUsingKeyComparator(
    const FieldDescriptor* field, const MapKeyComparator* key_comparator) {
  GOOGLE_CHECK(field->is_repeated())
      << "Field must be repeated: " << field->full_name();
  GOOGLE_CHECK(repeated_field_comparisons_.find(field) ==
        repeated_field_comparisons_.end())
      << "Cannot treat the same field as both "
      << repeated_field_comparisons_[field]
      << " and MAP. Field name is: " << field->full_name();
  map_field_key_comparator_[field] = key_comparator;
}